

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

Vec_Vec_t * Abc_NtkLevelize(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  Vec_Vec_t *p;
  void **ppvVar3;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  uVar1 = Abc_NtkLevel(pNtk);
  uVar7 = uVar1 + 1;
  p = (Vec_Vec_t *)malloc(0x10);
  uVar2 = 8;
  if (6 < uVar1) {
    uVar2 = uVar7;
  }
  p->nCap = uVar2;
  if (uVar2 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)(int)uVar2 << 3);
  }
  p->pArray = ppvVar3;
  if (-1 < (int)uVar1) {
    uVar6 = 0;
    do {
      pvVar4 = calloc(1,0x10);
      ppvVar3[uVar6] = pvVar4;
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  p->nSize = uVar7;
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar4 = pVVar5->pArray[lVar8];
      if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) {
        uVar7 = *(uint *)((long)pvVar4 + 0x14) >> 0xc;
        if ((int)uVar1 < (int)uVar7) {
          __assert_fail("(int)pObj->Level <= nLevels",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                        ,0x598,"Vec_Vec_t *Abc_NtkLevelize(Abc_Ntk_t *)");
        }
        Vec_VecPush(p,uVar7,pvVar4);
        pVVar5 = pNtk->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar5->nSize);
  }
  return p;
}

Assistant:

Vec_Vec_t * Abc_NtkLevelize( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, i;
    nLevels = Abc_NtkLevel( pNtk );
    vLevels = Vec_VecStart( nLevels + 1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        assert( (int)pObj->Level <= nLevels );
        Vec_VecPush( vLevels, pObj->Level, pObj );
    }
    return vLevels;
}